

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O3

int checkerBig(void)

{
  uint uVar1;
  FILE *__stream;
  char *__s;
  int iVar2;
  int d_1;
  int d;
  int local_30;
  int local_2c;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar1 = 0xffffffff;
  }
  else {
    iVar2 = 0;
    do {
      __s = ScanInt((FILE *)__stream,&local_2c);
      if (__s != "PASSED") goto LAB_001036fe;
      if (iVar2 != local_2c) {
        printf("wrong output -- ");
        __s = "FAILED";
        goto LAB_001036fe;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 5000);
    iVar2 = 5000;
    do {
      __s = ScanInt((FILE *)__stream,&local_30);
      if (__s != "PASSED") goto LAB_001036fe;
      if (iVar2 != local_30) {
        printf("wrong output -- ");
        __s = "FAILED";
        goto LAB_001036fe;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
    __s = "PASSED";
    if (iVar2 != 0) {
      __s = "FAILED";
    }
LAB_001036fe:
    fclose(__stream);
    puts(__s);
    uVar1 = (uint)(__s == "FAILED");
  }
  testN = testN + 1;
  return uVar1;
}

Assistant:

static int checkerBig(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i;
    const char* message = Pass;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 5000; i++) {
        int d;
        message = ScanInt(out, &d);
        if (message != Pass) {
            break;
        }
        if (d != i) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
    }
    if (message == Pass) {
        for (i = 0; i < 5000; i++) {
            int d;
            message = ScanInt(out, &d);
            if (message != Pass) {
                break;
            }
            if (d != 5000-i) {
                printf("wrong output -- ");
                message = Fail;
                break;
            }
        }
    }
    if (message == Pass && HaveGarbageAtTheEnd(out)) {
        message = Fail;
    }
    fclose(out);
    printf("%s\n", message);
    testN++;
    return message == Fail;
}